

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Rational * __thiscall
Matrix<Rational>::trace(Rational *__return_storage_ptr__,Matrix<Rational> *this)

{
  uint uVar1;
  matrix_error *this_00;
  uint uVar2;
  ulong uVar3;
  
  if (this->N == this->M) {
    uVar3 = 0;
    BigInteger::BigInteger(&__return_storage_ptr__->_numerator,0);
    BigInteger::BigInteger(&__return_storage_ptr__->_denominator,1);
    if (this->N * this->N != 0) {
      do {
        Rational::operator+=(__return_storage_ptr__,this->arr + uVar3);
        uVar1 = this->N;
        uVar2 = (int)uVar3 + uVar1 + 1;
        uVar3 = (ulong)uVar2;
      } while (uVar2 < uVar1 * uVar1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error(this_00,"Trying to calculate trace of a non-square matrix");
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Field Matrix<Field>::trace() const
{
    if(N != M)
        throw matrix_error("Trying to calculate trace of a non-square matrix");
    Field ans;
    for(unsigned i = 0; i < N * N; i += N + 1)
    {
        ans += arr[i];
    }
    return ans;
}